

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_pole_to_all_zero_digital_filter_coefficients.cc
# Opt level: O3

bool __thiscall
sptk::AllPoleToAllZeroDigitalFilterCoefficients::Run
          (AllPoleToAllZeroDigitalFilterCoefficients *this,
          vector<double,_std::allocator<double>_> *input_filter_coefficients,
          vector<double,_std::allocator<double>_> *output_filter_coefficients)

{
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  size_type __new_size;
  pointer pdVar4;
  double dVar5;
  
  if (this->is_valid_ == true) {
    pdVar2 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    __new_size = (long)pdVar3 - (long)pdVar2 >> 3;
    if (__new_size == (long)this->num_order_ + 1U) {
      bVar1 = false;
      if (output_filter_coefficients != (vector<double,_std::allocator<double>_> *)0x0) {
        dVar5 = *pdVar2;
        if ((dVar5 != 0.0) || (bVar1 = false, NAN(dVar5))) {
          pdVar4 = (output_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((long)(output_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 !=
              (long)pdVar3 - (long)pdVar2) {
            std::vector<double,_std::allocator<double>_>::resize
                      (output_filter_coefficients,__new_size);
            pdVar2 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pdVar3 = (input_filter_coefficients->super__Vector_base<double,_std::allocator<double>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            dVar5 = *pdVar2;
            pdVar4 = (output_filter_coefficients->
                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          *pdVar4 = 1.0 / dVar5;
          bVar1 = true;
          while (pdVar2 = pdVar2 + 1, pdVar2 != pdVar3) {
            pdVar4 = pdVar4 + 1;
            *pdVar4 = *pdVar2 * (1.0 / dVar5);
          }
        }
      }
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool AllPoleToAllZeroDigitalFilterCoefficients::Run(
    const std::vector<double>& input_filter_coefficients,
    std::vector<double>* output_filter_coefficients) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      input_filter_coefficients.size() != static_cast<std::size_t>(length) ||
      0.0 == input_filter_coefficients[0] ||
      NULL == output_filter_coefficients) {
    return false;
  }

  // Prepare memories.
  if (output_filter_coefficients->size() != static_cast<std::size_t>(length)) {
    output_filter_coefficients->resize(length);
  }

  // Perform conversion.
  const double z(1.0 / input_filter_coefficients[0]);
  (*output_filter_coefficients)[0] = z;
  std::transform(
      input_filter_coefficients.begin() + 1, input_filter_coefficients.end(),
      output_filter_coefficients->begin() + 1, [z](double x) { return x * z; });

  return true;
}